

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

void __thiscall
cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(cmCTestCoverageHandlerLocale *this)

{
  bool bVar1;
  int iVar2;
  string l;
  string local_68;
  string local_48;
  
  (this->lc_all)._M_dataplus._M_p = (pointer)&(this->lc_all).field_2;
  (this->lc_all)._M_string_length = 0;
  (this->lc_all).field_2._M_local_buf[0] = '\0';
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  bVar1 = cmsys::SystemTools::GetEnv("LC_ALL",&local_48);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)this);
  }
  iVar2 = std::__cxx11::string::compare((char *)this);
  if (iVar2 != 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"LC_ALL=C","");
    cmsys::SystemTools::PutEnv(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

cmCTestCoverageHandlerLocale()
  {
    std::string l;
    if (cmSystemTools::GetEnv("LC_ALL", l)) {
      this->lc_all = l;
    }
    if (this->lc_all != "C") {
      cmSystemTools::PutEnv("LC_ALL=C");
    }
  }